

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::ExceptionOr<capnp::RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>_>::
~ExceptionOr(ExceptionOr<capnp::RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>_>
             *this)

{
  NullableValue<capnp::RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>_>::
  ~NullableValue(&(this->value).ptr);
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)this);
  return;
}

Assistant:

ExceptionOr(T&& value): value(kj::mv(value)) {}